

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O2

If_LibLut_t * If_LibLutRead(char *FileName)

{
  float fVar1;
  uint uVar2;
  FILE *__stream;
  If_LibLut_t *__ptr;
  char *__ptr_00;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  float (*pafVar7) [33];
  bool bVar8;
  double dVar9;
  ulong local_448;
  char pBuffer [1000];
  
  __stream = fopen(FileName,"r");
  if (__stream == (FILE *)0x0) {
    __ptr = (If_LibLut_t *)0x0;
    Abc_Print(-1,"Cannot open LUT library file \"%s\".\n",FileName);
  }
  else {
    local_448 = 1;
    __ptr = (If_LibLut_t *)calloc(1,0x1198);
    __ptr_00 = Abc_UtilStrsav(FileName);
    __ptr->pName = __ptr_00;
    pafVar7 = __ptr->pLutDelays + 1;
    lVar6 = 0;
    bVar8 = false;
LAB_0038a191:
    pcVar3 = fgets(pBuffer,1000,__stream);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = strtok(pBuffer," \t\n");
      if ((pcVar3 != (char *)0x0) && (*pcVar3 != '#')) {
        uVar2 = atoi(pcVar3);
        if (local_448 != uVar2) {
          Abc_Print(1,"Error in the LUT library file \"%s\".\n",FileName);
          free(__ptr_00);
          free(__ptr);
          fclose(__stream);
          return (If_LibLut_t *)0x0;
        }
        pcVar3 = strtok((char *)0x0," \t\n");
        dVar9 = atof(pcVar3);
        __ptr->pLutAreas[local_448] = (float)dVar9;
        uVar4 = 0;
        while (pcVar3 = strtok((char *)0x0," \t\n"), pcVar3 != (char *)0x0) {
          dVar9 = atof(pcVar3);
          (*pafVar7)[uVar4] = (float)dVar9;
          uVar4 = uVar4 + 1;
        }
        if (local_448 < (uVar4 & 0xffffffff)) {
          free(__ptr_00);
          free(__ptr);
          Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",local_448 & 0xffffffff,
                    uVar4 & 0xffffffff,local_448 & 0xffffffff);
        }
        else {
          if (1 < uVar4) {
            __ptr->fVarPinDelays = 1;
            bVar8 = true;
          }
          if (local_448 != 0x20) {
            local_448 = local_448 + 1;
            lVar6 = lVar6 + 1;
            pafVar7 = pafVar7 + 1;
            goto LAB_0038a191;
          }
          free(__ptr_00);
          free(__ptr);
          Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
        }
        fclose(__stream);
        return (If_LibLut_t *)0x0;
      }
      goto LAB_0038a191;
    }
    __ptr->LutMax = (int)local_448 + -1;
    if (bVar8) {
      pafVar7 = __ptr->pLutDelays;
      for (uVar4 = 1; pafVar7 = pafVar7 + 1, uVar4 != (local_448 & 0xffffffff); uVar4 = uVar4 + 1) {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          fVar1 = (*pafVar7)[uVar5];
          if (fVar1 <= 0.0) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)fVar1,uVar5 & 0xffffffff,uVar4 & 0xffffffff);
          }
          if ((uVar5 != 0) && (fVar1 < pafVar7[-1][uVar5 + 0x20])) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)pafVar7[-1][uVar5 + 0x20],(double)fVar1,(ulong)((int)uVar5 - 1),
                      uVar4 & 0xffffffff,uVar5 & 0xffffffff,uVar4 & 0xffffffff);
          }
        }
      }
    }
    else {
      pafVar7 = __ptr->pLutDelays;
      uVar2 = 1;
      while (pafVar7 = pafVar7 + 1, bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
        if ((*pafVar7)[0] <= 0.0) {
          Abc_Print(0,
                    "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                    ,(double)(*pafVar7)[0],(ulong)uVar2);
        }
        uVar2 = uVar2 + 1;
      }
    }
    fclose(__stream);
  }
  return __ptr;
}

Assistant:

If_LibLut_t * If_LibLutRead( char * FileName )
{
    char pBuffer[1000], * pToken;
    If_LibLut_t * p;
    FILE * pFile;
    int i, k;

    pFile = fopen( FileName, "r" );
    if ( pFile == NULL )
    {
        Abc_Print( -1, "Cannot open LUT library file \"%s\".\n", FileName );
        return NULL;
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );
    p->pName = Abc_UtilStrsav( FileName );

    i = 1;
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library file \"%s\".\n", FileName );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            fclose( pFile );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            fclose( pFile );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            ABC_FREE( p->pName );
            ABC_FREE( p );
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            fclose( pFile );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    fclose( pFile );
    return p;
}